

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

EventLogEntry * __thiscall TTD::EventLog::RecordEnqueueTaskEvent(EventLog *this,Var taskVar)

{
  EventLogEntry *pEVar1;
  EventLogEntry *evt;
  ExternalCbRegisterCallEventLogEntry *ecEvent;
  Var taskVar_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  ecEvent = (ExternalCbRegisterCallEventLogEntry *)taskVar;
  taskVar_local = this;
  pEVar1 = RecordGetInitializedEvent<TTD::NSLogEvents::ExternalCbRegisterCallEventLogEntry,(TTD::NSLogEvents::EventKind)11>
                     (this,(ExternalCbRegisterCallEventLogEntry **)&evt);
  *(ExternalCbRegisterCallEventLogEntry **)evt = ecEvent;
  evt->EventTimeStamp = 0x7fffffffffffffff;
  return pEVar1;
}

Assistant:

NSLogEvents::EventLogEntry* EventLog::RecordEnqueueTaskEvent(Js::Var taskVar)
    {
        NSLogEvents::ExternalCbRegisterCallEventLogEntry* ecEvent = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::ExternalCbRegisterCallEventLogEntry, NSLogEvents::EventKind::ExternalCbRegisterCall>(&ecEvent);

        ecEvent->CallbackFunction = static_cast<TTDVar>(taskVar);
        ecEvent->LastNestedEventTime = TTD_EVENT_MAXTIME;

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteLiteralMsg("Enqueue Task: ");
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteVar(taskVar);
#endif

        return evt;
    }